

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

wchar_t * fmt::v8::detail::
          parse_align<wchar_t,fmt::v8::detail::specs_checker<fmt::v8::detail::specs_handler<wchar_t>>&>
                    (wchar_t *begin,wchar_t *end,
                    specs_checker<fmt::v8::detail::specs_handler<wchar_t>_> *handler)

{
  wchar_t wVar1;
  basic_format_specs<wchar_t> *pbVar2;
  wchar_t *pwVar3;
  ulong uVar4;
  wchar_t *pwVar5;
  align_t align;
  size_t i;
  ulong uVar6;
  bool bVar7;
  
  if (begin == end) {
    fmt::v8::detail::assert_fail
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
               ,0x8e2,"");
  }
  pwVar5 = begin + 1;
  pwVar3 = begin;
  if (pwVar5 < end) {
    pwVar3 = pwVar5;
  }
  do {
    wVar1 = *pwVar3;
    if (wVar1 == L'^') {
      align = center;
LAB_0017a8e0:
      if ((long)pwVar3 - (long)begin != 0) {
        if (*begin == L'{') {
          fmt::v8::detail::throw_format_error("invalid fill character \'{\'");
        }
        uVar4 = (long)pwVar3 - (long)begin >> 2;
        if ((long)uVar4 < 0) {
          fmt::v8::detail::assert_fail
                    ("/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/core.h"
                     ,0x195,"negative value");
        }
        if (4 < uVar4) {
          fmt::v8::detail::throw_format_error("invalid fill");
        }
        pbVar2 = (handler->super_specs_handler<wchar_t>).super_specs_setter<wchar_t>.specs_;
        uVar6 = 0;
        do {
          (pbVar2->fill).data_[uVar6] = begin[uVar6];
          uVar6 = uVar6 + 1;
        } while (uVar4 != uVar6);
        (pbVar2->fill).size_ = (uchar)uVar4;
        pwVar5 = pwVar3 + 1;
      }
      specs_checker<fmt::v8::detail::specs_handler<wchar_t>_>::on_align(handler,align);
      return pwVar5;
    }
    if (wVar1 == L'>') {
      align = right;
      goto LAB_0017a8e0;
    }
    if (wVar1 == L'<') {
      align = left;
      goto LAB_0017a8e0;
    }
    bVar7 = pwVar3 == begin;
    pwVar3 = begin;
    if (bVar7) {
      return begin;
    }
  } while( true );
}

Assistant:

FMT_CONSTEXPR auto parse_align(const Char* begin, const Char* end,
                               Handler&& handler) -> const Char* {
  FMT_ASSERT(begin != end, "");
  auto align = align::none;
  auto p = begin + code_point_length(begin);
  if (p >= end) p = begin;
  for (;;) {
    switch (to_ascii(*p)) {
    case '<':
      align = align::left;
      break;
    case '>':
      align = align::right;
      break;
    case '^':
      align = align::center;
      break;
    default:
      break;
    }
    if (align != align::none) {
      if (p != begin) {
        auto c = *begin;
        if (c == '{')
          return handler.on_error("invalid fill character '{'"), begin;
        handler.on_fill(basic_string_view<Char>(begin, to_unsigned(p - begin)));
        begin = p + 1;
      } else
        ++begin;
      handler.on_align(align);
      break;
    } else if (p == begin) {
      break;
    }
    p = begin;
  }
  return begin;
}